

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

void __thiscall
sptk::reaper::EpochTracker::CrossCorrelation
          (EpochTracker *this,vector<float,_std::allocator<float>_> *data,int32_t start,
          int32_t first_lag,int32_t n_lags,int32_t size,vector<float,_std::allocator<float>_> *corr)

{
  pointer pfVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  pointer pfVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  
  pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  std::vector<float,_std::allocator<float>_>::resize(corr,(long)n_lags);
  if (0 < size) {
    lVar4 = (long)start;
    fVar11 = 0.0;
    uVar5 = 0;
    do {
      fVar11 = fVar11 + pfVar1[lVar4 + uVar5] * pfVar1[lVar4 + uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)size != uVar5);
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      if (size < 1) {
        dVar2 = 0.0;
      }
      else {
        lVar6 = (long)first_lag;
        dVar2 = 0.0;
        do {
          dVar2 = dVar2 + (double)(pfVar1[lVar4 + lVar6] * pfVar1[lVar4 + lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < size + first_lag);
      }
      if (n_lags < 1) {
        return;
      }
      lVar10 = (long)first_lag;
      pfVar9 = pfVar1 + lVar10 + lVar4;
      lVar6 = -lVar10;
      lVar8 = 0;
      do {
        dVar13 = 0.0;
        lVar7 = lVar10;
        if (0 < size) {
          fVar12 = 0.0;
          uVar5 = 0;
          do {
            fVar12 = fVar12 + pfVar1[lVar4 + uVar5] * pfVar9[uVar5];
            uVar5 = uVar5 + 1;
          } while ((uint)size != uVar5);
          dVar13 = (double)fVar12;
          lVar7 = uVar5 - lVar6;
        }
        dVar3 = (double)(~-(ulong)(0.0 < dVar2) & 0x3ff0000000000000 |
                        (ulong)dVar2 & -(ulong)(0.0 < dVar2));
        dVar2 = dVar3 * (double)fVar11;
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        (corr->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar8] = (float)(dVar13 / dVar2);
        dVar2 = (double)(pfVar1[lVar4 + (int)lVar7] * pfVar1[lVar4 + (int)lVar7]) +
                (dVar3 - (double)(pfVar1[lVar4 + lVar10] * pfVar1[lVar4 + lVar10]));
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 1;
        pfVar9 = pfVar9 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar10 < n_lags + first_lag);
      return;
    }
  }
  if (n_lags < 1) {
    return;
  }
  memset((corr->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
         _M_start,0,(ulong)(uint)n_lags << 2);
  return;
}

Assistant:

void EpochTracker::CrossCorrelation(const std::vector<float>& data, int32_t start,
                                    int32_t first_lag, int32_t n_lags,
                                    int32_t size, std::vector<float>* corr) {
  const float* input = (&(data.front())) + start;
  corr->resize(n_lags);
  float energy = 0.0;  // Zero-lag energy part of the normalizer.
  for (int32_t i = 0; i < size; ++i) {
    energy += input[i] * input[i];
  }
  if (energy == 0.0) {  // Bail out if no energy is found.
    for (int32_t i = 0; i < n_lags; ++i) {
      (*corr)[i] = 0.0;
    }
    return;
  }
  int32_t limit = first_lag + size;
  double lag_energy = 0.0;  // Energy at the period hypothesis lag.
  for (int32_t i = first_lag; i < limit; ++i) {
    lag_energy += input[i] * input[i];
  }
  int32_t last_lag = first_lag + n_lags;
  int32_t oind = 0;  // Index for storing output values.
  for (int32_t lag = first_lag; lag < last_lag; ++lag, ++oind) {
    float sum = 0.0;
    int32_t lag_ind = lag;
    for (int32_t i = 0; i < size; ++i, ++lag_ind) {
      sum += input[i] * input[lag_ind];
    }
    if (lag_energy <= 0.0)
      lag_energy = 1.0;
    (*corr)[oind] = sum / sqrt(energy * lag_energy);
    lag_energy -= input[lag] * input[lag];  // Discard old sample.
    lag_energy += input[lag_ind] * input[lag_ind];  // Pick up the new sample.
  }
  return;
}